

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void end_examples<sparse_parameters>(lda *l,sparse_parameters *weights)

{
  bool bVar1;
  float **ppfVar2;
  float *pfVar3;
  float *pfVar4;
  long in_RDI;
  float fVar5;
  double dVar6;
  size_t i;
  weight *wp;
  float decay;
  float decay_component;
  iterator iter;
  sparse_iterator<float> *in_stack_ffffffffffffff78;
  sparse_parameters *in_stack_ffffffffffffff80;
  ulong local_68;
  
  sparse_parameters::begin(in_stack_ffffffffffffff80);
  while( true ) {
    sparse_parameters::end(in_stack_ffffffffffffff80);
    bVar1 = sparse_iterator<float>::operator!=
                      ((sparse_iterator<float> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                      );
    if (!bVar1) break;
    fVar5 = v_array<float>::last((v_array<float> *)(in_RDI + 0x48));
    ppfVar2 = v_array<float>::end((v_array<float> *)(in_RDI + 0x48));
    pfVar4 = *ppfVar2;
    in_stack_ffffffffffffff80 = (sparse_parameters *)(-1.0 - *(double *)(in_RDI + 0x180));
    pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x21cf5e);
    dVar6 = std::exp((double)(ulong)(uint)(fVar5 - pfVar4[(int)((double)in_stack_ffffffffffffff80 +
                                                               (double)pfVar3[*(uint *)(*(long *)(
                                                  in_RDI + 0x188) + 0x3478)])]));
    dVar6 = std::fmin(5.26354424712089e-315,dVar6);
    pfVar4 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x21cfd1);
    for (local_68 = 0; local_68 < *(uint *)(*(long *)(in_RDI + 0x188) + 0x3478);
        local_68 = local_68 + 1) {
      pfVar4[local_68] = SUB84(dVar6,0) * pfVar4[local_68];
    }
    sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_ffffffffffffff80);
  }
  return;
}

Assistant:

void end_examples(lda &l, T &weights)
{
  for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
  {
    float decay_component =
        l.decay_levels.last() - l.decay_levels.end()[(int)(-1 - l.example_t + (&(*iter))[l.all->lda])];
    float decay = fmin(1.f, correctedExp(decay_component));

    weight *wp = &(*iter);
    for (size_t i = 0; i < l.all->lda; ++i) wp[i] *= decay;
  }
}